

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int vflag;
  
  bVar4 = (byte)bit;
  uVar7 = (flag - 1U & 0x100) + bit;
  uVar6 = uVar7 >> 6;
  uVar5 = (ulong)(uVar7 < 0x40) << (bVar4 & 0x3f);
  uVar8 = (ulong)(uVar6 == 1) << (bVar4 & 0x3f);
  uVar9 = (ulong)(uVar6 == 2) << (bVar4 & 0x3f);
  uVar2 = r->d[0];
  r->d[0] = r->d[0] + uVar5;
  puVar1 = r->d + 1;
  uVar5 = (ulong)CARRY8(uVar2,uVar5);
  uVar2 = *puVar1;
  uVar3 = *puVar1 + uVar8;
  *puVar1 = uVar3 + uVar5;
  puVar1 = r->d + 2;
  uVar5 = (ulong)(CARRY8(uVar2,uVar8) || CARRY8(uVar3,uVar5));
  uVar2 = *puVar1;
  uVar3 = *puVar1 + uVar9;
  *puVar1 = uVar3 + uVar5;
  r->d[3] = r->d[3] + ((ulong)(uVar6 == 3) << (bVar4 & 0x3f)) +
            (ulong)(CARRY8(uVar2,uVar9) || CARRY8(uVar3,uVar5));
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    secp256k1_uint128 t;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(bit < 256);

    bit += ((uint32_t) vflag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = secp256k1_u128_to_u64(&t);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_u128_hi_u64(&t) == 0);
}